

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ReceivedServerConnect(Curl_easy *data,_Bool *received)

{
  size_t sVar1;
  char *pcVar2;
  bool local_5d;
  int local_5c;
  _Bool response;
  int ftpcode;
  ssize_t nread;
  timediff_t timeout_ms;
  anon_union_280_3_6d7b35ba_for_proto *paStack_40;
  int socketstate;
  pingpong *pp;
  ftp_conn *ftpc;
  curl_socket_t data_sock;
  curl_socket_t ctrl_sock;
  connectdata *conn;
  _Bool *received_local;
  Curl_easy *data_local;
  
  _data_sock = data->conn;
  ftpc._4_4_ = _data_sock->sock[0];
  ftpc._0_4_ = _data_sock->sock[1];
  paStack_40 = &_data_sock->proto;
  timeout_ms._4_4_ = 0;
  *received = false;
  pp = (pingpong *)paStack_40;
  conn = (connectdata *)received;
  received_local = (_Bool *)data;
  nread = ftp_timeleft_accept(data);
  if ((received_local != (_Bool *)0x0) && ((*(ulong *)(received_local + 0xa52) >> 0x1c & 1) != 0)) {
    Curl_infof((Curl_easy *)received_local,"Checking for server connect");
  }
  if (nread < 0) {
    Curl_failf((Curl_easy *)received_local,"Accept timeout occurred while waiting server connect");
    data_local._4_4_ = CURLE_FTP_ACCEPT_TIMEOUT;
  }
  else {
    sVar1 = Curl_dyn_len(&(paStack_40->ftpc).pp.recvbuf);
    if ((sVar1 == 0) || (pcVar2 = Curl_dyn_ptr(&(paStack_40->ftpc).pp.recvbuf), *pcVar2 < '4')) {
      local_5d = (paStack_40->ftpc).pp.overflow == 0;
      if (local_5d) {
        timeout_ms._4_4_ = Curl_socket_check(ftpc._4_4_,(curl_socket_t)ftpc,-1,0);
      }
      local_5d = !local_5d;
      if (timeout_ms._4_4_ == 0xffffffff) {
        Curl_failf((Curl_easy *)received_local,"Error while waiting for server connect");
        data_local._4_4_ = CURLE_FTP_ACCEPT_FAILED;
      }
      else {
        if (timeout_ms._4_4_ != 0) {
          if ((timeout_ms._4_4_ & 8) == 0) {
            if ((timeout_ms._4_4_ & 1) != 0) {
              local_5d = true;
            }
          }
          else {
            if ((received_local != (_Bool *)0x0) &&
               ((*(ulong *)(received_local + 0xa52) >> 0x1c & 1) != 0)) {
              Curl_infof((Curl_easy *)received_local,"Ready to accept data connection from server");
            }
            *(undefined1 *)&(conn->bundle_node).ptr = 1;
          }
        }
        if (local_5d) {
          if ((received_local != (_Bool *)0x0) &&
             ((*(ulong *)(received_local + 0xa52) >> 0x1c & 1) != 0)) {
            Curl_infof((Curl_easy *)received_local,"Ctrl conn has data while waiting for data conn")
            ;
          }
          Curl_GetFTPResponse((Curl_easy *)received_local,(ssize_t *)&stack0xffffffffffffffa8,
                              &local_5c);
          if (local_5c / 100 < 4) {
            data_local._4_4_ = CURLE_WEIRD_SERVER_REPLY;
          }
          else {
            data_local._4_4_ = CURLE_FTP_ACCEPT_FAILED;
          }
        }
        else {
          data_local._4_4_ = CURLE_OK;
        }
      }
    }
    else {
      if ((received_local != (_Bool *)0x0) &&
         ((*(ulong *)(received_local + 0xa52) >> 0x1c & 1) != 0)) {
        Curl_infof((Curl_easy *)received_local,
                   "There is negative response in cache while serv connect");
      }
      Curl_GetFTPResponse((Curl_easy *)received_local,(ssize_t *)&stack0xffffffffffffffa8,&local_5c)
      ;
      data_local._4_4_ = CURLE_FTP_ACCEPT_FAILED;
    }
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode ReceivedServerConnect(struct Curl_easy *data, bool *received)
{
  struct connectdata *conn = data->conn;
  curl_socket_t ctrl_sock = conn->sock[FIRSTSOCKET];
  curl_socket_t data_sock = conn->sock[SECONDARYSOCKET];
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  struct pingpong *pp = &ftpc->pp;
  int socketstate = 0;
  timediff_t timeout_ms;
  ssize_t nread;
  int ftpcode;
  bool response = FALSE;

  *received = FALSE;

  timeout_ms = ftp_timeleft_accept(data);
  infof(data, "Checking for server connect");
  if(timeout_ms < 0) {
    /* if a timeout was already reached, bail out */
    failf(data, "Accept timeout occurred while waiting server connect");
    return CURLE_FTP_ACCEPT_TIMEOUT;
  }

  /* First check whether there is a cached response from server */
  if(Curl_dyn_len(&pp->recvbuf) && (*Curl_dyn_ptr(&pp->recvbuf) > '3')) {
    /* Data connection could not be established, let's return */
    infof(data, "There is negative response in cache while serv connect");
    (void)Curl_GetFTPResponse(data, &nread, &ftpcode);
    return CURLE_FTP_ACCEPT_FAILED;
  }

  if(pp->overflow)
    /* there is pending control data still in the buffer to read */
    response = TRUE;
  else
    socketstate = Curl_socket_check(ctrl_sock, data_sock, CURL_SOCKET_BAD, 0);

  /* see if the connection request is already here */
  switch(socketstate) {
  case -1: /* error */
    /* let's die here */
    failf(data, "Error while waiting for server connect");
    return CURLE_FTP_ACCEPT_FAILED;
  case 0:  /* Server connect is not received yet */
    break; /* loop */
  default:
    if(socketstate & CURL_CSELECT_IN2) {
      infof(data, "Ready to accept data connection from server");
      *received = TRUE;
    }
    else if(socketstate & CURL_CSELECT_IN)
      response = TRUE;
    break;
  }
  if(response) {
    infof(data, "Ctrl conn has data while waiting for data conn");
    (void)Curl_GetFTPResponse(data, &nread, &ftpcode);

    if(ftpcode/100 > 3)
      return CURLE_FTP_ACCEPT_FAILED;

    return CURLE_WEIRD_SERVER_REPLY;
  }

  return CURLE_OK;
}